

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObjectEnumerator.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5ArgumentsObjectEnumerator::Init
          (ES5ArgumentsObjectEnumerator *this,EnumeratorCache *enumeratorCache)

{
  EnumeratorFlags flags;
  BOOL BVar1;
  DynamicObject *this_00;
  ScriptContext *requestContext;
  EnumeratorCache *enumeratorCache_local;
  ES5ArgumentsObjectEnumerator *this_local;
  
  ArgumentsObjectPrefixEnumerator::Reset(&this->super_ArgumentsObjectPrefixEnumerator);
  this->enumeratedFormalsInObjectArrayCount = 0;
  this_00 = &Memory::WriteBarrierPtr<Js::ArgumentsObject>::operator->
                       (&(this->super_ArgumentsObjectPrefixEnumerator).argumentsObject)->
             super_DynamicObject;
  flags = (this->super_ArgumentsObjectPrefixEnumerator).flags;
  requestContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  BVar1 = DynamicObject::GetEnumerator
                    (this_00,&this->objectEnumerator,flags,requestContext,enumeratorCache);
  return BVar1;
}

Assistant:

BOOL ES5ArgumentsObjectEnumerator::Init(EnumeratorCache * enumeratorCache)
    {
        __super::Reset();
        this->enumeratedFormalsInObjectArrayCount = 0;
        return argumentsObject->DynamicObject::GetEnumerator(&objectEnumerator, flags, GetScriptContext(), enumeratorCache);
    }